

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eth_linux.c
# Opt level: O3

int csp_eth_tx_frame(void *driver_data,csp_eth_header_t *eth_frame)

{
  ssize_t sVar1;
  sockaddr_ll socket_address;
  sockaddr local_18;
  uint local_8;
  
  local_18._0_8_ = (ulong)*(uint *)((long)driver_data + 0xb0) << 0x20;
  local_18.sa_data._10_4_ = *(undefined4 *)eth_frame->ether_dhost;
  local_18.sa_data._6_4_ = 0x6000000;
  local_8 = (uint)*(ushort *)(eth_frame->ether_dhost + 4);
  sVar1 = sendto(*(int *)((long)driver_data + 0x98),eth_frame,
                 (ulong)(ushort)(eth_frame->seg_size << 8 | eth_frame->seg_size >> 8) + 0x16,0,
                 &local_18,0x14);
  return (uint)(sVar1 >> 0x3f) & 0xfffffff5;
}

Assistant:

int csp_eth_tx_frame(void * driver_data, csp_eth_header_t *eth_frame) {

    const eth_context_t * ctx = (eth_context_t*)driver_data;

    /* Destination socket address */
    struct sockaddr_ll socket_address = {};
    socket_address.sll_ifindex = ctx->if_idx.ifr_ifindex;
    socket_address.sll_halen = CSP_ETH_ALEN;
    memcpy(socket_address.sll_addr, eth_frame->ether_dhost, CSP_ETH_ALEN);

    uint32_t txsize = sizeof(csp_eth_header_t) + be16toh(eth_frame->seg_size);

    if (sendto(ctx->sockfd, (void*)eth_frame, txsize, 0, (struct sockaddr*)&socket_address, sizeof(struct sockaddr_ll)) < 0) {
        return CSP_ERR_DRIVER;
    }

    return CSP_ERR_NONE;
}